

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O3

void __thiscall chrono::ChLinkMask::ResetNconstr(ChLinkMask *this,int newnconstr)

{
  int iVar1;
  ChConstraintTwoBodies *pCVar2;
  size_t __new_size;
  long lVar3;
  
  iVar1 = this->nconstr;
  if (iVar1 != newnconstr) {
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        pCVar2 = (this->constraints).
                 super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar3];
        if (pCVar2 != (ChConstraintTwoBodies *)0x0) {
          (**(code **)((long)(pCVar2->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint +
                      8))();
          (this->constraints).
          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar3] = (ChConstraintTwoBodies *)0x0;
          iVar1 = this->nconstr;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar1);
    }
    __new_size = (size_t)newnconstr;
    this->nconstr = newnconstr;
    std::vector<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>::
    resize(&this->constraints,__new_size);
    if (0 < this->nconstr) {
      lVar3 = 0;
      do {
        pCVar2 = (ChConstraintTwoBodies *)
                 ChConstraintTwoBodies::operator_new((ChConstraintTwoBodies *)0x120,__new_size);
        ChConstraintTwoBodies::ChConstraintTwoBodies(pCVar2);
        (this->constraints).
        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar3] = pCVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->nconstr);
    }
  }
  return;
}

Assistant:

void ChLinkMask::ResetNconstr(int newnconstr) {
    if (nconstr != newnconstr) {
        for (int i = 0; i < nconstr; i++)
            if (constraints[i]) {
                delete constraints[i];
                constraints[i] = nullptr;
            }

        nconstr = newnconstr;

        constraints.resize(nconstr);

        for (int i = 0; i < nconstr; i++) {
            constraints[i] = new ChConstraintTwoBodies;
        }
    }
}